

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O3

void uv__epoll_ctl_flush(int epollfd,uv__iou *ctl,epoll_event (*events) [256])

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  int *piVar4;
  uint uVar5;
  uint uVar6;
  epoll_event oldevents [256];
  epoll_event local_c28 [256];
  
  if (ctl->ringfd == -1) {
    __assert_fail("ctl->ringfd != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/linux.c"
                  ,0x4b3,
                  "void uv__epoll_ctl_flush(int, struct uv__iou *, struct epoll_event (*)[256])");
  }
  uVar6 = *ctl->sqtail - *ctl->sqhead;
  if (uVar6 == 0) {
    __assert_fail("*ctl->sqhead != *ctl->sqtail",
                  "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/linux.c"
                  ,0x4b4,
                  "void uv__epoll_ctl_flush(int, struct uv__iou *, struct epoll_event (*)[256])");
  }
  do {
    lVar3 = syscall(0x1aa,(ulong)(uint)ctl->ringfd,(ulong)uVar6,(ulong)uVar6,1,0,0);
    uVar5 = (uint)lVar3;
    if (uVar5 != 0xffffffff) {
      if (-1 < (int)uVar5) goto LAB_0015da96;
      break;
    }
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  perror("libuv: io_uring_enter(getevents)");
LAB_0015da96:
  if (uVar6 == uVar5) {
    if (*ctl->sqhead != *ctl->sqtail) {
      __assert_fail("*ctl->sqhead == *ctl->sqtail",
                    "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/linux.c"
                    ,0x4c1,
                    "void uv__epoll_ctl_flush(int, struct uv__iou *, struct epoll_event (*)[256])");
    }
    memcpy(local_c28,events,0xc00);
    do {
      while( true ) {
        do {
          uVar6 = *ctl->cqhead;
          if (uVar6 == *ctl->cqtail) {
            return;
          }
          *ctl->cqhead = uVar6 + 1;
          lVar3 = (ulong)(uVar6 & ctl->cqmask) * 0x10;
          iVar1 = *(int *)((long)ctl->cqe + lVar3 + 8);
        } while (iVar1 == 0);
        uVar2 = *(undefined8 *)((long)ctl->cqe + lVar3);
        uVar6 = (uint)uVar2;
        uVar5 = uVar6 & 3;
        if (uVar5 != 1) break;
        if (iVar1 != -0x11) goto LAB_0015db53;
        uv__epoll_ctl_prep(epollfd,ctl,events,3,(int)((ulong)uVar2 >> 0x20),
                           local_c28 + (uVar6 >> 2 & 0xff));
      }
    } while (uVar5 == 2);
  }
LAB_0015db53:
  abort();
}

Assistant:

static void uv__epoll_ctl_flush(int epollfd,
                                struct uv__iou* ctl,
                                struct epoll_event (*events)[256]) {
  struct epoll_event oldevents[256];
  struct uv__io_uring_cqe* cqe;
  uint32_t oldslot;
  uint32_t slot;
  uint32_t n;
  int fd;
  int op;
  int rc;

  STATIC_ASSERT(sizeof(oldevents) == sizeof(*events));
  assert(ctl->ringfd != -1);
  assert(*ctl->sqhead != *ctl->sqtail);

  n = *ctl->sqtail - *ctl->sqhead;
  do
    rc = uv__io_uring_enter(ctl->ringfd, n, n, UV__IORING_ENTER_GETEVENTS);
  while (rc == -1 && errno == EINTR);

  if (rc < 0)
    perror("libuv: io_uring_enter(getevents)");  /* Can't happen. */

  if (rc != (int) n)
    abort();

  assert(*ctl->sqhead == *ctl->sqtail);

  memcpy(oldevents, *events, sizeof(*events));

  /* Failed submissions are either EPOLL_CTL_DEL commands for file descriptors
   * that have been closed, or EPOLL_CTL_ADD commands for file descriptors
   * that we are already watching. Ignore the former and retry the latter
   * with EPOLL_CTL_MOD.
   */
  while (*ctl->cqhead != *ctl->cqtail) {
    slot = (*ctl->cqhead)++ & ctl->cqmask;

    cqe = ctl->cqe;
    cqe = &cqe[slot];

    if (cqe->res == 0)
      continue;

    fd = cqe->user_data >> 32;
    op = 3 & cqe->user_data;
    oldslot = 255 & (cqe->user_data >> 2);

    if (op == EPOLL_CTL_DEL)
      continue;

    if (op != EPOLL_CTL_ADD)
      abort();

    if (cqe->res != -EEXIST)
      abort();

    uv__epoll_ctl_prep(epollfd,
                       ctl,
                       events,
                       EPOLL_CTL_MOD,
                       fd,
                       &oldevents[oldslot]);
  }
}